

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main_inner(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  ulong uVar2;
  ParsedIR *ir_;
  char *pcVar3;
  undefined8 uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4bc0;
  undefined1 local_4ba8 [44];
  uint i;
  undefined1 local_4b68 [40];
  string compiled_output;
  undefined1 local_4b28 [8];
  string json;
  undefined1 local_4b08 [8];
  CompilerReflection compiler;
  undefined1 local_26c0 [8];
  Parser spirv_parser;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spirv_file;
  CLICallbacks local_1eb8;
  undefined1 local_1e40 [8];
  CLIParser parser;
  anon_class_8_1_89897ddb local_1da8;
  anon_class_8_1_89897ddb local_1da0;
  function<void_(CLIParser_&)> local_1d98;
  anon_class_8_1_89897ddb local_1d78;
  function<void_(CLIParser_&)> local_1d70;
  anon_class_8_1_89897ddb local_1d50;
  function<void_(CLIParser_&)> local_1d48;
  anon_class_8_1_89897ddb local_1d28;
  function<void_(CLIParser_&)> local_1d20;
  anon_class_8_1_89897ddb local_1d00;
  function<void_(CLIParser_&)> local_1cf8;
  anon_class_8_1_89897ddb local_1cd8;
  function<void_(CLIParser_&)> local_1cd0;
  anon_class_8_1_89897ddb local_1cb0;
  function<void_(CLIParser_&)> local_1ca8;
  anon_class_8_1_89897ddb local_1c88;
  function<void_(CLIParser_&)> local_1c80;
  anon_class_8_1_89897ddb local_1c60;
  function<void_(CLIParser_&)> local_1c58;
  anon_class_8_1_89897ddb local_1c38;
  function<void_(CLIParser_&)> local_1c30;
  anon_class_8_1_89897ddb local_1c10;
  function<void_(CLIParser_&)> local_1c08;
  anon_class_8_1_89897ddb local_1be8;
  function<void_(CLIParser_&)> local_1be0;
  anon_class_8_1_89897ddb local_1bc0;
  function<void_(CLIParser_&)> local_1bb8;
  anon_class_8_1_89897ddb local_1b98;
  function<void_(CLIParser_&)> local_1b90;
  anon_class_8_1_89897ddb local_1b70;
  function<void_(CLIParser_&)> local_1b68;
  anon_class_8_1_89897ddb local_1b48;
  function<void_(CLIParser_&)> local_1b40;
  anon_class_8_1_89897ddb local_1b20;
  function<void_(CLIParser_&)> local_1b18;
  anon_class_8_1_89897ddb local_1af8;
  function<void_(CLIParser_&)> local_1af0;
  anon_class_8_1_89897ddb local_1ad0;
  function<void_(CLIParser_&)> local_1ac8;
  anon_class_8_1_89897ddb local_1aa8;
  function<void_(CLIParser_&)> local_1aa0;
  anon_class_8_1_89897ddb local_1a80;
  function<void_(CLIParser_&)> local_1a78;
  anon_class_8_1_89897ddb local_1a58;
  function<void_(CLIParser_&)> local_1a50;
  anon_class_8_1_89897ddb local_1a30;
  function<void_(CLIParser_&)> local_1a28;
  anon_class_8_1_89897ddb local_1a08;
  function<void_(CLIParser_&)> local_1a00;
  anon_class_8_1_89897ddb local_19e0;
  function<void_(CLIParser_&)> local_19d8;
  anon_class_8_1_89897ddb local_19b8;
  function<void_(CLIParser_&)> local_19b0;
  anon_class_8_1_89897ddb local_1990;
  function<void_(CLIParser_&)> local_1988;
  anon_class_8_1_89897ddb local_1968;
  function<void_(CLIParser_&)> local_1960;
  anon_class_8_1_89897ddb local_1940;
  function<void_(CLIParser_&)> local_1938;
  anon_class_8_1_89897ddb local_1918;
  function<void_(CLIParser_&)> local_1910;
  anon_class_8_1_89897ddb local_18f0;
  function<void_(CLIParser_&)> local_18e8;
  anon_class_8_1_89897ddb local_18c8;
  function<void_(CLIParser_&)> local_18c0;
  anon_class_8_1_89897ddb local_18a0;
  function<void_(CLIParser_&)> local_1898;
  anon_class_8_1_89897ddb local_1878;
  function<void_(CLIParser_&)> local_1870;
  anon_class_8_1_89897ddb local_1850;
  function<void_(CLIParser_&)> local_1848;
  anon_class_8_1_89897ddb local_1828;
  function<void_(CLIParser_&)> local_1820;
  anon_class_8_1_89897ddb local_1800;
  function<void_(CLIParser_&)> local_17f8;
  anon_class_8_1_89897ddb local_17d8;
  function<void_(CLIParser_&)> local_17d0;
  anon_class_8_1_89897ddb local_17b0;
  function<void_(CLIParser_&)> local_17a8;
  anon_class_8_1_89897ddb local_1788;
  function<void_(CLIParser_&)> local_1780;
  anon_class_8_1_89897ddb local_1760;
  function<void_(CLIParser_&)> local_1758;
  anon_class_8_1_89897ddb local_1738;
  function<void_(CLIParser_&)> local_1730;
  anon_class_8_1_89897ddb local_1710;
  function<void_(CLIParser_&)> local_1708;
  anon_class_8_1_89897ddb local_16e8;
  function<void_(CLIParser_&)> local_16e0;
  anon_class_8_1_89897ddb local_16c0;
  function<void_(CLIParser_&)> local_16b8;
  anon_class_8_1_89897ddb local_1698;
  function<void_(CLIParser_&)> local_1690;
  anon_class_8_1_89897ddb local_1670;
  function<void_(CLIParser_&)> local_1668;
  anon_class_8_1_89897ddb local_1648;
  function<void_(CLIParser_&)> local_1640;
  anon_class_8_1_89897ddb local_1620;
  function<void_(CLIParser_&)> local_1618;
  anon_class_8_1_89897ddb local_15f8;
  function<void_(CLIParser_&)> local_15f0;
  anon_class_8_1_89897ddb local_15d0;
  function<void_(CLIParser_&)> local_15c8;
  anon_class_8_1_89897ddb local_15a8;
  function<void_(CLIParser_&)> local_15a0;
  anon_class_8_1_89897ddb local_1580;
  function<void_(CLIParser_&)> local_1578;
  anon_class_8_1_89897ddb local_1558;
  function<void_(CLIParser_&)> local_1550;
  anon_class_8_1_89897ddb local_1530;
  function<void_(CLIParser_&)> local_1528;
  anon_class_8_1_89897ddb local_1508;
  function<void_(CLIParser_&)> local_1500;
  anon_class_8_1_89897ddb local_14e0;
  function<void_(CLIParser_&)> local_14d8;
  anon_class_8_1_89897ddb local_14b8;
  function<void_(CLIParser_&)> local_14b0;
  anon_class_8_1_89897ddb local_1490;
  function<void_(CLIParser_&)> local_1488;
  anon_class_8_1_89897ddb local_1468;
  function<void_(CLIParser_&)> local_1460;
  anon_class_8_1_89897ddb local_1440;
  function<void_(CLIParser_&)> local_1438;
  anon_class_8_1_89897ddb local_1418;
  function<void_(CLIParser_&)> local_1410;
  anon_class_8_1_89897ddb local_13f0;
  function<void_(CLIParser_&)> local_13e8;
  anon_class_8_1_89897ddb local_13c8;
  function<void_(CLIParser_&)> local_13c0;
  anon_class_8_1_89897ddb local_13a0;
  function<void_(CLIParser_&)> local_1398;
  anon_class_8_1_89897ddb local_1378;
  function<void_(CLIParser_&)> local_1370;
  anon_class_8_1_89897ddb local_1350;
  function<void_(CLIParser_&)> local_1348;
  anon_class_8_1_89897ddb local_1328;
  function<void_(CLIParser_&)> local_1320;
  anon_class_8_1_89897ddb local_1300;
  function<void_(CLIParser_&)> local_12f8;
  anon_class_8_1_89897ddb local_12d8;
  function<void_(CLIParser_&)> local_12d0;
  anon_class_8_1_89897ddb local_12b0;
  function<void_(CLIParser_&)> local_12a8;
  anon_class_8_1_89897ddb local_1288;
  function<void_(CLIParser_&)> local_1280;
  anon_class_8_1_89897ddb local_1260;
  function<void_(CLIParser_&)> local_1258;
  anon_class_8_1_89897ddb local_1238;
  function<void_(CLIParser_&)> local_1230;
  anon_class_8_1_89897ddb local_1210;
  function<void_(CLIParser_&)> local_1208;
  anon_class_8_1_89897ddb local_11e8;
  function<void_(CLIParser_&)> local_11e0;
  anon_class_8_1_89897ddb local_11c0;
  function<void_(CLIParser_&)> local_11b8;
  anon_class_8_1_89897ddb local_1198;
  function<void_(CLIParser_&)> local_1190;
  anon_class_8_1_89897ddb local_1170;
  function<void_(CLIParser_&)> local_1168;
  anon_class_8_1_89897ddb local_1148;
  function<void_(CLIParser_&)> local_1140;
  anon_class_1_0_00000001 local_1119;
  function<void_(CLIParser_&)> local_1118;
  anon_class_1_0_00000001 local_10e1;
  function<void_(CLIParser_&)> local_10e0;
  undefined1 local_10c0 [8];
  CLICallbacks cbs;
  CLIArguments args;
  char **argv_local;
  int argc_local;
  
  args._4136_8_ = argv;
  CLIArguments::CLIArguments((CLIArguments *)&cbs.default_handler._M_invoker);
  CLICallbacks::CLICallbacks((CLICallbacks *)local_10c0);
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__0,void>
            ((function<void(CLIParser&)> *)&local_10e0,&local_10e1);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--help",&local_10e0);
  std::function<void_(CLIParser_&)>::~function(&local_10e0);
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__1,void>
            ((function<void(CLIParser&)> *)&local_1118,&local_1119);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--revision",&local_1118);
  std::function<void_(CLIParser_&)>::~function(&local_1118);
  local_1148.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__2,void>
            ((function<void(CLIParser&)> *)&local_1140,&local_1148);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--output",&local_1140);
  std::function<void_(CLIParser_&)>::~function(&local_1140);
  local_1170.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__3,void>
            ((function<void(CLIParser&)> *)&local_1168,&local_1170);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--es",&local_1168);
  std::function<void_(CLIParser_&)>::~function(&local_1168);
  local_1198.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__4,void>
            ((function<void(CLIParser&)> *)&local_1190,&local_1198);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--no-es",&local_1190);
  std::function<void_(CLIParser_&)>::~function(&local_1190);
  local_11c0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__5,void>
            ((function<void(CLIParser&)> *)&local_11b8,&local_11c0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--version",&local_11b8);
  std::function<void_(CLIParser_&)>::~function(&local_11b8);
  local_11e8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__6,void>
            ((function<void(CLIParser&)> *)&local_11e0,&local_11e8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--dump-resources",&local_11e0);
  std::function<void_(CLIParser_&)>::~function(&local_11e0);
  local_1210.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__7,void>
            ((function<void(CLIParser&)> *)&local_1208,&local_1210);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--force-temporary",&local_1208);
  std::function<void_(CLIParser_&)>::~function(&local_1208);
  local_1238.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__8,void>
            ((function<void(CLIParser&)> *)&local_1230,&local_1238);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--flatten-ubo",&local_1230);
  std::function<void_(CLIParser_&)>::~function(&local_1230);
  local_1260.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__9,void>
            ((function<void(CLIParser&)> *)&local_1258,&local_1260);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--fixup-clipspace",&local_1258);
  std::function<void_(CLIParser_&)>::~function(&local_1258);
  local_1288.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__10,void>
            ((function<void(CLIParser&)> *)&local_1280,&local_1288);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--flip-vert-y",&local_1280);
  std::function<void_(CLIParser_&)>::~function(&local_1280);
  local_12b0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__11,void>
            ((function<void(CLIParser&)> *)&local_12a8,&local_12b0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--iterations",&local_12a8);
  std::function<void_(CLIParser_&)>::~function(&local_12a8);
  local_12d8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__12,void>
            ((function<void(CLIParser&)> *)&local_12d0,&local_12d8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--cpp",&local_12d0);
  std::function<void_(CLIParser_&)>::~function(&local_12d0);
  local_1300.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__13,void>
            ((function<void(CLIParser&)> *)&local_12f8,&local_1300);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--reflect",&local_12f8);
  std::function<void_(CLIParser_&)>::~function(&local_12f8);
  local_1328.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__14,void>
            ((function<void(CLIParser&)> *)&local_1320,&local_1328);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--cpp-interface-name",&local_1320);
  std::function<void_(CLIParser_&)>::~function(&local_1320);
  local_1350.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__15,void>
            ((function<void(CLIParser&)> *)&local_1348,&local_1350);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--metal",&local_1348);
  std::function<void_(CLIParser_&)>::~function(&local_1348);
  local_1378.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__16,void>
            ((function<void(CLIParser&)> *)&local_1370,&local_1378);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--glsl-emit-push-constant-as-ubo",&local_1370);
  std::function<void_(CLIParser_&)>::~function(&local_1370);
  local_13a0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__17,void>
            ((function<void(CLIParser&)> *)&local_1398,&local_13a0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--glsl-emit-ubo-as-plain-uniforms",&local_1398);
  std::function<void_(CLIParser_&)>::~function(&local_1398);
  local_13c8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__18,void>
            ((function<void(CLIParser&)> *)&local_13c0,&local_13c8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--glsl-force-flattened-io-blocks",&local_13c0);
  std::function<void_(CLIParser_&)>::~function(&local_13c0);
  local_13f0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__19,void>
            ((function<void(CLIParser&)> *)&local_13e8,&local_13f0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--glsl-remap-ext-framebuffer-fetch",&local_13e8);
  std::function<void_(CLIParser_&)>::~function(&local_13e8);
  local_1418.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__20,void>
            ((function<void(CLIParser&)> *)&local_1410,&local_1418);
  CLICallbacks::add((CLICallbacks *)local_10c0,
                    "--vulkan-glsl-disable-ext-samplerless-texture-functions",&local_1410);
  std::function<void_(CLIParser_&)>::~function(&local_1410);
  local_1440.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__21,void>
            ((function<void(CLIParser&)> *)&local_1438,&local_1440);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--disable-storage-image-qualifier-deduction",
                    &local_1438);
  std::function<void_(CLIParser_&)>::~function(&local_1438);
  local_1468.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__22,void>
            ((function<void(CLIParser&)> *)&local_1460,&local_1468);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--force-zero-initialized-variables",&local_1460);
  std::function<void_(CLIParser_&)>::~function(&local_1460);
  local_1490.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__23,void>
            ((function<void(CLIParser&)> *)&local_1488,&local_1490);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl",&local_1488);
  std::function<void_(CLIParser_&)>::~function(&local_1488);
  local_14b8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__24,void>
            ((function<void(CLIParser&)> *)&local_14b0,&local_14b8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--hlsl",&local_14b0);
  std::function<void_(CLIParser_&)>::~function(&local_14b0);
  local_14e0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__25,void>
            ((function<void(CLIParser&)> *)&local_14d8,&local_14e0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--hlsl-enable-compat",&local_14d8);
  std::function<void_(CLIParser_&)>::~function(&local_14d8);
  local_1508.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__26,void>
            ((function<void(CLIParser&)> *)&local_1500,&local_1508);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--hlsl-support-nonzero-basevertex-baseinstance",
                    &local_1500);
  std::function<void_(CLIParser_&)>::~function(&local_1500);
  local_1530.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__27,void>
            ((function<void(CLIParser&)> *)&local_1528,&local_1530);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--hlsl-auto-binding",&local_1528);
  std::function<void_(CLIParser_&)>::~function(&local_1528);
  local_1558.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__28,void>
            ((function<void(CLIParser&)> *)&local_1550,&local_1558);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--hlsl-force-storage-buffer-as-uav",&local_1550);
  std::function<void_(CLIParser_&)>::~function(&local_1550);
  local_1580.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__29,void>
            ((function<void(CLIParser&)> *)&local_1578,&local_1580);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--hlsl-nonwritable-uav-texture-as-srv",&local_1578);
  std::function<void_(CLIParser_&)>::~function(&local_1578);
  local_15a8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__30,void>
            ((function<void(CLIParser&)> *)&local_15a0,&local_15a8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--hlsl-enable-16bit-types",&local_15a0);
  std::function<void_(CLIParser_&)>::~function(&local_15a0);
  local_15d0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__31,void>
            ((function<void(CLIParser&)> *)&local_15c8,&local_15d0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--vulkan-semantics",&local_15c8);
  std::function<void_(CLIParser_&)>::~function(&local_15c8);
  local_15f8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__32,void>
            ((function<void(CLIParser&)> *)&local_15f0,&local_15f8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"-V",&local_15f0);
  std::function<void_(CLIParser_&)>::~function(&local_15f0);
  local_1620.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__33,void>
            ((function<void(CLIParser&)> *)&local_1618,&local_1620);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--flatten-multidimensional-arrays",&local_1618);
  std::function<void_(CLIParser_&)>::~function(&local_1618);
  local_1648.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__34,void>
            ((function<void(CLIParser&)> *)&local_1640,&local_1648);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--no-420pack-extension",&local_1640);
  std::function<void_(CLIParser_&)>::~function(&local_1640);
  local_1670.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__35,void>
            ((function<void(CLIParser&)> *)&local_1668,&local_1670);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-capture-output",&local_1668);
  std::function<void_(CLIParser_&)>::~function(&local_1668);
  local_1698.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__36,void>
            ((function<void(CLIParser&)> *)&local_1690,&local_1698);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-swizzle-texture-samples",&local_1690);
  std::function<void_(CLIParser_&)>::~function(&local_1690);
  local_16c0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__37,void>
            ((function<void(CLIParser&)> *)&local_16b8,&local_16c0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-ios",&local_16b8);
  std::function<void_(CLIParser_&)>::~function(&local_16b8);
  local_16e8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__38,void>
            ((function<void(CLIParser&)> *)&local_16e0,&local_16e8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-pad-fragment-output",&local_16e0);
  std::function<void_(CLIParser_&)>::~function(&local_16e0);
  local_1710.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__39,void>
            ((function<void(CLIParser&)> *)&local_1708,&local_1710);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-domain-lower-left",&local_1708);
  std::function<void_(CLIParser_&)>::~function(&local_1708);
  local_1738.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__40,void>
            ((function<void(CLIParser&)> *)&local_1730,&local_1738);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-argument-buffers",&local_1730);
  std::function<void_(CLIParser_&)>::~function(&local_1730);
  local_1760.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__41,void>
            ((function<void(CLIParser&)> *)&local_1758,&local_1760);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-discrete-descriptor-set",&local_1758);
  std::function<void_(CLIParser_&)>::~function(&local_1758);
  local_1788.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__42,void>
            ((function<void(CLIParser&)> *)&local_1780,&local_1788);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-device-argument-buffer",&local_1780);
  std::function<void_(CLIParser_&)>::~function(&local_1780);
  local_17b0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__43,void>
            ((function<void(CLIParser&)> *)&local_17a8,&local_17b0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-texture-buffer-native",&local_17a8);
  std::function<void_(CLIParser_&)>::~function(&local_17a8);
  local_17d8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__44,void>
            ((function<void(CLIParser&)> *)&local_17d0,&local_17d8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-framebuffer-fetch",&local_17d0);
  std::function<void_(CLIParser_&)>::~function(&local_17d0);
  local_1800.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__45,void>
            ((function<void(CLIParser&)> *)&local_17f8,&local_1800);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-invariant-float-math",&local_17f8);
  std::function<void_(CLIParser_&)>::~function(&local_17f8);
  local_1828.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__46,void>
            ((function<void(CLIParser&)> *)&local_1820,&local_1828);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-emulate-cube-array",&local_1820);
  std::function<void_(CLIParser_&)>::~function(&local_1820);
  local_1850.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__47,void>
            ((function<void(CLIParser&)> *)&local_1848,&local_1850);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-multiview",&local_1848);
  std::function<void_(CLIParser_&)>::~function(&local_1848);
  local_1878.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__48,void>
            ((function<void(CLIParser&)> *)&local_1870,&local_1878);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-multiview-no-layered-rendering",&local_1870);
  std::function<void_(CLIParser_&)>::~function(&local_1870);
  local_18a0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__49,void>
            ((function<void(CLIParser&)> *)&local_1898,&local_18a0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-view-index-from-device-index",&local_1898);
  std::function<void_(CLIParser_&)>::~function(&local_1898);
  local_18c8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__50,void>
            ((function<void(CLIParser&)> *)&local_18c0,&local_18c8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-dispatch-base",&local_18c0);
  std::function<void_(CLIParser_&)>::~function(&local_18c0);
  local_18f0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__51,void>
            ((function<void(CLIParser&)> *)&local_18e8,&local_18f0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-dynamic-buffer",&local_18e8);
  std::function<void_(CLIParser_&)>::~function(&local_18e8);
  local_1918.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__52,void>
            ((function<void(CLIParser&)> *)&local_1910,&local_1918);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-decoration-binding",&local_1910);
  std::function<void_(CLIParser_&)>::~function(&local_1910);
  local_1940.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__53,void>
            ((function<void(CLIParser&)> *)&local_1938,&local_1940);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-force-active-argument-buffer-resources",
                    &local_1938);
  std::function<void_(CLIParser_&)>::~function(&local_1938);
  local_1968.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__54,void>
            ((function<void(CLIParser&)> *)&local_1960,&local_1968);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-inline-uniform-block",&local_1960);
  std::function<void_(CLIParser_&)>::~function(&local_1960);
  local_1990.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__55,void>
            ((function<void(CLIParser&)> *)&local_1988,&local_1990);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-force-native-arrays",&local_1988);
  std::function<void_(CLIParser_&)>::~function(&local_1988);
  local_19b8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__56,void>
            ((function<void(CLIParser&)> *)&local_19b0,&local_19b8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-disable-frag-depth-builtin",&local_19b0);
  std::function<void_(CLIParser_&)>::~function(&local_19b0);
  local_19e0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__57,void>
            ((function<void(CLIParser&)> *)&local_19d8,&local_19e0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-disable-frag-stencil-ref-builtin",&local_19d8)
  ;
  std::function<void_(CLIParser_&)>::~function(&local_19d8);
  local_1a08.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__58,void>
            ((function<void(CLIParser&)> *)&local_1a00,&local_1a08);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-enable-frag-output-mask",&local_1a00);
  std::function<void_(CLIParser_&)>::~function(&local_1a00);
  local_1a30.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__59,void>
            ((function<void(CLIParser&)> *)&local_1a28,&local_1a30);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-no-clip-distance-user-varying",&local_1a28);
  std::function<void_(CLIParser_&)>::~function(&local_1a28);
  local_1a58.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__60,void>
            ((function<void(CLIParser&)> *)&local_1a50,&local_1a58);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-shader-input",&local_1a50);
  std::function<void_(CLIParser_&)>::~function(&local_1a50);
  local_1a80.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__61,void>
            ((function<void(CLIParser&)> *)&local_1a78,&local_1a80);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-multi-patch-workgroup",&local_1a78);
  std::function<void_(CLIParser_&)>::~function(&local_1a78);
  local_1aa8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__62,void>
            ((function<void(CLIParser&)> *)&local_1aa0,&local_1aa8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-vertex-for-tessellation",&local_1aa0);
  std::function<void_(CLIParser_&)>::~function(&local_1aa0);
  local_1ad0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__63,void>
            ((function<void(CLIParser&)> *)&local_1ac8,&local_1ad0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-additional-fixed-sample-mask",&local_1ac8);
  std::function<void_(CLIParser_&)>::~function(&local_1ac8);
  local_1af8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__64,void>
            ((function<void(CLIParser&)> *)&local_1af0,&local_1af8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-arrayed-subpass-input",&local_1af0);
  std::function<void_(CLIParser_&)>::~function(&local_1af0);
  local_1b20.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__65,void>
            ((function<void(CLIParser&)> *)&local_1b18,&local_1b20);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--extension",&local_1b18);
  std::function<void_(CLIParser_&)>::~function(&local_1b18);
  local_1b48.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__66,void>
            ((function<void(CLIParser&)> *)&local_1b40,&local_1b48);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--rename-entry-point",&local_1b40);
  std::function<void_(CLIParser_&)>::~function(&local_1b40);
  local_1b70.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__67,void>
            ((function<void(CLIParser&)> *)&local_1b68,&local_1b70);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--entry",&local_1b68);
  std::function<void_(CLIParser_&)>::~function(&local_1b68);
  local_1b98.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__68,void>
            ((function<void(CLIParser&)> *)&local_1b90,&local_1b98);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--stage",&local_1b90);
  std::function<void_(CLIParser_&)>::~function(&local_1b90);
  local_1bc0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__69,void>
            ((function<void(CLIParser&)> *)&local_1bb8,&local_1bc0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--separate-shader-objects",&local_1bb8);
  std::function<void_(CLIParser_&)>::~function(&local_1bb8);
  local_1be8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__70,void>
            ((function<void(CLIParser&)> *)&local_1be0,&local_1be8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--set-hlsl-vertex-input-semantic",&local_1be0);
  std::function<void_(CLIParser_&)>::~function(&local_1be0);
  local_1c10.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__71,void>
            ((function<void(CLIParser&)> *)&local_1c08,&local_1c10);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--remap",&local_1c08);
  std::function<void_(CLIParser_&)>::~function(&local_1c08);
  local_1c38.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__72,void>
            ((function<void(CLIParser&)> *)&local_1c30,&local_1c38);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--remap-variable-type",&local_1c30);
  std::function<void_(CLIParser_&)>::~function(&local_1c30);
  local_1c60.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__73,void>
            ((function<void(CLIParser&)> *)&local_1c58,&local_1c60);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--rename-interface-variable",&local_1c58);
  std::function<void_(CLIParser_&)>::~function(&local_1c58);
  local_1c88.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__74,void>
            ((function<void(CLIParser&)> *)&local_1c80,&local_1c88);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--pls-in",&local_1c80);
  std::function<void_(CLIParser_&)>::~function(&local_1c80);
  local_1cb0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__75,void>
            ((function<void(CLIParser&)> *)&local_1ca8,&local_1cb0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--pls-out",&local_1ca8);
  std::function<void_(CLIParser_&)>::~function(&local_1ca8);
  local_1cd8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__76,void>
            ((function<void(CLIParser&)> *)&local_1cd0,&local_1cd8);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--shader-model",&local_1cd0);
  std::function<void_(CLIParser_&)>::~function(&local_1cd0);
  local_1d00.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__77,void>
            ((function<void(CLIParser&)> *)&local_1cf8,&local_1d00);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--msl-version",&local_1cf8);
  std::function<void_(CLIParser_&)>::~function(&local_1cf8);
  local_1d28.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__78,void>
            ((function<void(CLIParser&)> *)&local_1d20,&local_1d28);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--remove-unused-variables",&local_1d20);
  std::function<void_(CLIParser_&)>::~function(&local_1d20);
  local_1d50.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__79,void>
            ((function<void(CLIParser&)> *)&local_1d48,&local_1d50);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--combined-samplers-inherit-bindings",&local_1d48);
  std::function<void_(CLIParser_&)>::~function(&local_1d48);
  local_1d78.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__80,void>
            ((function<void(CLIParser&)> *)&local_1d70,&local_1d78);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--no-support-nonzero-baseinstance",&local_1d70);
  std::function<void_(CLIParser_&)>::~function(&local_1d70);
  local_1da0.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(CLIParser&)>::function<main_inner(int,char**)::__81,void>
            ((function<void(CLIParser&)> *)&local_1d98,&local_1da0);
  CLICallbacks::add((CLICallbacks *)local_10c0,"--emit-line-directives",&local_1d98);
  std::function<void_(CLIParser_&)>::~function(&local_1d98);
  local_1da8.args = (CLIArguments *)&cbs.default_handler._M_invoker;
  std::function<void(char_const*)>::operator=
            ((function<void(char_const*)> *)&cbs.error_handler._M_invoker,&local_1da8);
  std::function<void()>::operator=
            ((function<void()> *)&cbs.callbacks._M_h._M_single_bucket,
             (anon_class_1_0_00000001 *)&parser.field_0x8f);
  CLICallbacks::CLICallbacks(&local_1eb8,(CLICallbacks *)local_10c0);
  CLIParser::CLIParser((CLIParser *)local_1e40,&local_1eb8,argc + -1,(char **)(args._4136_8_ + 8));
  CLICallbacks::~CLICallbacks(&local_1eb8);
  bVar1 = CLIParser::parse((CLIParser *)local_1e40);
  if (bVar1) {
    if (((byte)parser.argv & 1) == 0) {
      if (cbs.default_handler._M_invoker == (_Invoker_type)0x0) {
        fprintf(_stderr,"Didn\'t specify input file.\n");
        print_help();
        argv_local._4_4_ = 1;
      }
      else {
        read_spirv_file((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        (spirv_parser.forward_pointer_fixups.stack_storage.aligned_char + 0x38),
                        (char *)cbs.default_handler._M_invoker);
        bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           (spirv_parser.forward_pointer_fixups.stack_storage.aligned_char + 0x38));
        if (bVar1) {
          argv_local._4_4_ = 1;
        }
        else {
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            this = &compiler.json_stream.
                    super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (spirv_parser.forward_pointer_fixups.stack_storage.aligned_char + 0x38));
            spirv_cross::Parser::Parser
                      ((Parser *)local_26c0,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &compiler.json_stream.
                        super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            spirv_cross::Parser::parse((Parser *)local_26c0);
            ir_ = spirv_cross::Parser::get_parsed_ir((Parser *)local_26c0);
            spirv_cross::CompilerReflection::CompilerReflection
                      ((CompilerReflection *)local_4b08,ir_);
            spirv_cross::CompilerReflection::set_format
                      ((CompilerReflection *)local_4b08,(string *)&args.iterations);
            spirv_cross::CompilerReflection::compile_abi_cxx11_((CompilerReflection *)local_4b28);
            if (args.input == (char *)0x0) {
              uVar4 = std::__cxx11::string::c_str();
              printf("%s",uVar4);
            }
            else {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              write_string_to_file(args.input,pcVar3);
            }
            argv_local._4_4_ = 0;
            std::__cxx11::string::~string((string *)local_4b28);
            spirv_cross::CompilerReflection::~CompilerReflection((CompilerReflection *)local_4b08);
            spirv_cross::Parser::~Parser((Parser *)local_26c0);
          }
          else {
            std::__cxx11::string::string((string *)(local_4b68 + 0x20));
            if (args.entry_point_rename.stack_storage.aligned_char._568_4_ == 1) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_4ba8 + 0x28),
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         (spirv_parser.forward_pointer_fixups.stack_storage.aligned_char + 0x38));
              compile_iteration_abi_cxx11_
                        ((CLIArguments *)local_4b68,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &cbs.default_handler._M_invoker);
              std::__cxx11::string::operator=((string *)(local_4b68 + 0x20),(string *)local_4b68);
              std::__cxx11::string::~string((string *)local_4b68);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_4ba8 + 0x28))
              ;
            }
            else {
              for (local_4ba8._36_4_ = 0;
                  (uint)local_4ba8._36_4_ <
                  (uint)args.entry_point_rename.stack_storage.aligned_char._568_4_;
                  local_4ba8._36_4_ = local_4ba8._36_4_ + 1) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          (&local_4bc0,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           (spirv_parser.forward_pointer_fixups.stack_storage.aligned_char + 0x38));
                compile_iteration_abi_cxx11_
                          ((CLIArguments *)local_4ba8,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &cbs.default_handler._M_invoker);
                std::__cxx11::string::operator=((string *)(local_4b68 + 0x20),(string *)local_4ba8);
                std::__cxx11::string::~string((string *)local_4ba8);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4bc0);
              }
            }
            if (args.input == (char *)0x0) {
              uVar4 = std::__cxx11::string::c_str();
              printf("%s",uVar4);
            }
            else {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              write_string_to_file(args.input,pcVar3);
            }
            argv_local._4_4_ = 0;
            std::__cxx11::string::~string((string *)(local_4b68 + 0x20));
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (spirv_parser.forward_pointer_fixups.stack_storage.aligned_char + 0x38));
      }
    }
    else {
      argv_local._4_4_ = 0;
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  CLIParser::~CLIParser((CLIParser *)local_1e40);
  CLICallbacks::~CLICallbacks((CLICallbacks *)local_10c0);
  CLIArguments::~CLIArguments((CLIArguments *)&cbs.default_handler._M_invoker);
  return argv_local._4_4_;
}

Assistant:

static int main_inner(int argc, char *argv[])
{
	CLIArguments args;
	CLICallbacks cbs;

	cbs.add("--help", [](CLIParser &parser) {
		print_help();
		parser.end();
	});
	cbs.add("--revision", [](CLIParser &parser) {
		print_version();
		parser.end();
	});
	cbs.add("--output", [&args](CLIParser &parser) { args.output = parser.next_string(); });
	cbs.add("--es", [&args](CLIParser &) {
		args.es = true;
		args.set_es = true;
	});
	cbs.add("--no-es", [&args](CLIParser &) {
		args.es = false;
		args.set_es = true;
	});
	cbs.add("--version", [&args](CLIParser &parser) {
		args.version = parser.next_uint();
		args.set_version = true;
	});
	cbs.add("--dump-resources", [&args](CLIParser &) { args.dump_resources = true; });
	cbs.add("--force-temporary", [&args](CLIParser &) { args.force_temporary = true; });
	cbs.add("--flatten-ubo", [&args](CLIParser &) { args.flatten_ubo = true; });
	cbs.add("--fixup-clipspace", [&args](CLIParser &) { args.fixup = true; });
	cbs.add("--flip-vert-y", [&args](CLIParser &) { args.yflip = true; });
	cbs.add("--iterations", [&args](CLIParser &parser) { args.iterations = parser.next_uint(); });
	cbs.add("--cpp", [&args](CLIParser &) { args.cpp = true; });
	cbs.add("--reflect", [&args](CLIParser &parser) { args.reflect = parser.next_value_string("json"); });
	cbs.add("--cpp-interface-name", [&args](CLIParser &parser) { args.cpp_interface_name = parser.next_string(); });
	cbs.add("--metal", [&args](CLIParser &) { args.msl = true; }); // Legacy compatibility
	cbs.add("--glsl-emit-push-constant-as-ubo", [&args](CLIParser &) { args.glsl_emit_push_constant_as_ubo = true; });
	cbs.add("--glsl-emit-ubo-as-plain-uniforms", [&args](CLIParser &) { args.glsl_emit_ubo_as_plain_uniforms = true; });
	cbs.add("--glsl-force-flattened-io-blocks", [&args](CLIParser &) { args.glsl_force_flattened_io_blocks = true; });
	cbs.add("--glsl-remap-ext-framebuffer-fetch", [&args](CLIParser &parser) {
		uint32_t input_index = parser.next_uint();
		uint32_t color_attachment = parser.next_uint();
		args.glsl_ext_framebuffer_fetch.push_back({ input_index, color_attachment });
	});
	cbs.add("--vulkan-glsl-disable-ext-samplerless-texture-functions",
	        [&args](CLIParser &) { args.vulkan_glsl_disable_ext_samplerless_texture_functions = true; });
	cbs.add("--disable-storage-image-qualifier-deduction",
	        [&args](CLIParser &) { args.enable_storage_image_qualifier_deduction = false; });
	cbs.add("--force-zero-initialized-variables",
	        [&args](CLIParser &) { args.force_zero_initialized_variables = true; });
	cbs.add("--msl", [&args](CLIParser &) { args.msl = true; });
	cbs.add("--hlsl", [&args](CLIParser &) { args.hlsl = true; });
	cbs.add("--hlsl-enable-compat", [&args](CLIParser &) { args.hlsl_compat = true; });
	cbs.add("--hlsl-support-nonzero-basevertex-baseinstance",
	        [&args](CLIParser &) { args.hlsl_support_nonzero_base = true; });
	cbs.add("--hlsl-auto-binding", [&args](CLIParser &parser) {
		args.hlsl_binding_flags |= hlsl_resource_type_to_flag(parser.next_string());
	});
	cbs.add("--hlsl-force-storage-buffer-as-uav",
	        [&args](CLIParser &) { args.hlsl_force_storage_buffer_as_uav = true; });
	cbs.add("--hlsl-nonwritable-uav-texture-as-srv",
	        [&args](CLIParser &) { args.hlsl_nonwritable_uav_texture_as_srv = true; });
	cbs.add("--hlsl-enable-16bit-types", [&args](CLIParser &) { args.hlsl_enable_16bit_types = true; });
	cbs.add("--vulkan-semantics", [&args](CLIParser &) { args.vulkan_semantics = true; });
	cbs.add("-V", [&args](CLIParser &) { args.vulkan_semantics = true; });
	cbs.add("--flatten-multidimensional-arrays", [&args](CLIParser &) { args.flatten_multidimensional_arrays = true; });
	cbs.add("--no-420pack-extension", [&args](CLIParser &) { args.use_420pack_extension = false; });
	cbs.add("--msl-capture-output", [&args](CLIParser &) { args.msl_capture_output_to_buffer = true; });
	cbs.add("--msl-swizzle-texture-samples", [&args](CLIParser &) { args.msl_swizzle_texture_samples = true; });
	cbs.add("--msl-ios", [&args](CLIParser &) { args.msl_ios = true; });
	cbs.add("--msl-pad-fragment-output", [&args](CLIParser &) { args.msl_pad_fragment_output = true; });
	cbs.add("--msl-domain-lower-left", [&args](CLIParser &) { args.msl_domain_lower_left = true; });
	cbs.add("--msl-argument-buffers", [&args](CLIParser &) { args.msl_argument_buffers = true; });
	cbs.add("--msl-discrete-descriptor-set",
	        [&args](CLIParser &parser) { args.msl_discrete_descriptor_sets.push_back(parser.next_uint()); });
	cbs.add("--msl-device-argument-buffer",
	        [&args](CLIParser &parser) { args.msl_device_argument_buffers.push_back(parser.next_uint()); });
	cbs.add("--msl-texture-buffer-native", [&args](CLIParser &) { args.msl_texture_buffer_native = true; });
	cbs.add("--msl-framebuffer-fetch", [&args](CLIParser &) { args.msl_framebuffer_fetch = true; });
	cbs.add("--msl-invariant-float-math", [&args](CLIParser &) { args.msl_invariant_float_math = true; });
	cbs.add("--msl-emulate-cube-array", [&args](CLIParser &) { args.msl_emulate_cube_array = true; });
	cbs.add("--msl-multiview", [&args](CLIParser &) { args.msl_multiview = true; });
	cbs.add("--msl-multiview-no-layered-rendering",
	        [&args](CLIParser &) { args.msl_multiview_layered_rendering = false; });
	cbs.add("--msl-view-index-from-device-index",
	        [&args](CLIParser &) { args.msl_view_index_from_device_index = true; });
	cbs.add("--msl-dispatch-base", [&args](CLIParser &) { args.msl_dispatch_base = true; });
	cbs.add("--msl-dynamic-buffer", [&args](CLIParser &parser) {
		args.msl_argument_buffers = true;
		// Make sure next_uint() is called in-order.
		uint32_t desc_set = parser.next_uint();
		uint32_t binding = parser.next_uint();
		args.msl_dynamic_buffers.push_back(make_pair(desc_set, binding));
	});
	cbs.add("--msl-decoration-binding", [&args](CLIParser &) { args.msl_decoration_binding = true; });
	cbs.add("--msl-force-active-argument-buffer-resources",
	        [&args](CLIParser &) { args.msl_force_active_argument_buffer_resources = true; });
	cbs.add("--msl-inline-uniform-block", [&args](CLIParser &parser) {
		args.msl_argument_buffers = true;
		// Make sure next_uint() is called in-order.
		uint32_t desc_set = parser.next_uint();
		uint32_t binding = parser.next_uint();
		args.msl_inline_uniform_blocks.push_back(make_pair(desc_set, binding));
	});
	cbs.add("--msl-force-native-arrays", [&args](CLIParser &) { args.msl_force_native_arrays = true; });
	cbs.add("--msl-disable-frag-depth-builtin", [&args](CLIParser &) { args.msl_enable_frag_depth_builtin = false; });
	cbs.add("--msl-disable-frag-stencil-ref-builtin",
	        [&args](CLIParser &) { args.msl_enable_frag_stencil_ref_builtin = false; });
	cbs.add("--msl-enable-frag-output-mask",
	        [&args](CLIParser &parser) { args.msl_enable_frag_output_mask = parser.next_hex_uint(); });
	cbs.add("--msl-no-clip-distance-user-varying",
	        [&args](CLIParser &) { args.msl_enable_clip_distance_user_varying = false; });
	cbs.add("--msl-shader-input", [&args](CLIParser &parser) {
		MSLShaderInput input;
		// Make sure next_uint() is called in-order.
		input.location = parser.next_uint();
		const char *format = parser.next_value_string("other");
		if (strcmp(format, "any32") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_ANY32;
		else if (strcmp(format, "any16") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_ANY16;
		else if (strcmp(format, "u16") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_UINT16;
		else if (strcmp(format, "u8") == 0)
			input.format = MSL_SHADER_INPUT_FORMAT_UINT8;
		else
			input.format = MSL_SHADER_INPUT_FORMAT_OTHER;
		input.vecsize = parser.next_uint();
		args.msl_shader_inputs.push_back(input);
	});
	cbs.add("--msl-multi-patch-workgroup", [&args](CLIParser &) { args.msl_multi_patch_workgroup = true; });
	cbs.add("--msl-vertex-for-tessellation", [&args](CLIParser &) { args.msl_vertex_for_tessellation = true; });
	cbs.add("--msl-additional-fixed-sample-mask",
	        [&args](CLIParser &parser) { args.msl_additional_fixed_sample_mask = parser.next_hex_uint(); });
	cbs.add("--msl-arrayed-subpass-input", [&args](CLIParser &) { args.msl_arrayed_subpass_input = true; });
	cbs.add("--extension", [&args](CLIParser &parser) { args.extensions.push_back(parser.next_string()); });
	cbs.add("--rename-entry-point", [&args](CLIParser &parser) {
		auto old_name = parser.next_string();
		auto new_name = parser.next_string();
		auto model = stage_to_execution_model(parser.next_string());
		args.entry_point_rename.push_back({ old_name, new_name, move(model) });
	});
	cbs.add("--entry", [&args](CLIParser &parser) { args.entry = parser.next_string(); });
	cbs.add("--stage", [&args](CLIParser &parser) { args.entry_stage = parser.next_string(); });
	cbs.add("--separate-shader-objects", [&args](CLIParser &) { args.sso = true; });
	cbs.add("--set-hlsl-vertex-input-semantic", [&args](CLIParser &parser) {
		HLSLVertexAttributeRemap remap;
		remap.location = parser.next_uint();
		remap.semantic = parser.next_string();
		args.hlsl_attr_remap.push_back(move(remap));
	});

	cbs.add("--remap", [&args](CLIParser &parser) {
		string src = parser.next_string();
		string dst = parser.next_string();
		uint32_t components = parser.next_uint();
		args.remaps.push_back({ move(src), move(dst), components });
	});

	cbs.add("--remap-variable-type", [&args](CLIParser &parser) {
		string var_name = parser.next_string();
		string new_type = parser.next_string();
		args.variable_type_remaps.push_back({ move(var_name), move(new_type) });
	});

	cbs.add("--rename-interface-variable", [&args](CLIParser &parser) {
		StorageClass cls = StorageClassMax;
		string clsStr = parser.next_string();
		if (clsStr == "in")
			cls = StorageClassInput;
		else if (clsStr == "out")
			cls = StorageClassOutput;

		uint32_t loc = parser.next_uint();
		string var_name = parser.next_string();
		args.interface_variable_renames.push_back({ cls, loc, move(var_name) });
	});

	cbs.add("--pls-in", [&args](CLIParser &parser) {
		auto fmt = pls_format(parser.next_string());
		auto name = parser.next_string();
		args.pls_in.push_back({ move(fmt), move(name) });
	});
	cbs.add("--pls-out", [&args](CLIParser &parser) {
		auto fmt = pls_format(parser.next_string());
		auto name = parser.next_string();
		args.pls_out.push_back({ move(fmt), move(name) });
	});
	cbs.add("--shader-model", [&args](CLIParser &parser) {
		args.shader_model = parser.next_uint();
		args.set_shader_model = true;
	});
	cbs.add("--msl-version", [&args](CLIParser &parser) {
		args.msl_version = parser.next_uint();
		args.set_msl_version = true;
	});

	cbs.add("--remove-unused-variables", [&args](CLIParser &) { args.remove_unused = true; });
	cbs.add("--combined-samplers-inherit-bindings",
	        [&args](CLIParser &) { args.combined_samplers_inherit_bindings = true; });

	cbs.add("--no-support-nonzero-baseinstance", [&](CLIParser &) { args.support_nonzero_baseinstance = false; });
	cbs.add("--emit-line-directives", [&args](CLIParser &) { args.emit_line_directives = true; });

	cbs.default_handler = [&args](const char *value) { args.input = value; };
	cbs.error_handler = [] { print_help(); };

	CLIParser parser{ move(cbs), argc - 1, argv + 1 };
	if (!parser.parse())
		return EXIT_FAILURE;
	else if (parser.ended_state)
		return EXIT_SUCCESS;

	if (!args.input)
	{
		fprintf(stderr, "Didn't specify input file.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto spirv_file = read_spirv_file(args.input);
	if (spirv_file.empty())
		return EXIT_FAILURE;

	// Special case reflection because it has little to do with the path followed by code-outputting compilers
	if (!args.reflect.empty())
	{
		Parser spirv_parser(move(spirv_file));
		spirv_parser.parse();

		CompilerReflection compiler(move(spirv_parser.get_parsed_ir()));
		compiler.set_format(args.reflect);
		auto json = compiler.compile();
		if (args.output)
			write_string_to_file(args.output, json.c_str());
		else
			printf("%s", json.c_str());
		return EXIT_SUCCESS;
	}

	string compiled_output;

	if (args.iterations == 1)
		compiled_output = compile_iteration(args, move(spirv_file));
	else
	{
		for (unsigned i = 0; i < args.iterations; i++)
			compiled_output = compile_iteration(args, spirv_file);
	}

	if (args.output)
		write_string_to_file(args.output, compiled_output.c_str());
	else
		printf("%s", compiled_output.c_str());

	return EXIT_SUCCESS;
}